

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal.hpp
# Opt level: O2

void tao::pegtl::normal<queryparse::string_content>::
     raise<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>&>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *param_2)

{
  parse_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = (parse_error *)__cxa_allocate_exception(0x28);
  internal::demangle<queryparse::string_content>();
  std::operator+(&local_38,"parse error matching ",&bStack_58);
  parse_error::
  parse_error<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
            (this,&local_38,in);
  __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

static void raise( const Input& in, States&&... /*unused*/ )
         {
            throw parse_error( "parse error matching " + internal::demangle< Rule >(), in );
         }